

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::
     TryIntegerCast<duckdb::IntegerDecimalCastData<signed_char>,true,true,duckdb::IntegerDecimalCastOperation,true,(char)46>
               (char *buf,idx_t len,IntegerDecimalCastData<signed_char> *result,bool strict)

{
  byte in_CL;
  void *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  undefined7 unaff_retaddr;
  idx_t in_stack_00000020;
  char *in_stack_00000028;
  bool local_22;
  ulong local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  local_18 = in_RSI;
  while( true ) {
    local_22 = false;
    if (local_18 != 0) {
      local_22 = StringUtil::CharacterIsSpace(*in_RDI);
    }
    if (local_22 == false) break;
    in_RDI = in_RDI + 1;
    local_18 = local_18 - 1;
  }
  if (local_18 == 0) {
    bVar1 = false;
  }
  else {
    memset(in_RDX,0,0x18);
    if (*in_RDI == '-') {
      bVar1 = IntegerCastLoop<duckdb::IntegerDecimalCastData<signed_char>,true,true,duckdb::IntegerDecimalCastOperation,(char)46>
                        (in_stack_00000028,in_stack_00000020,
                         (IntegerDecimalCastData<signed_char> *)buf,len._7_1_);
    }
    else {
      if ((1 < local_18) && (*in_RDI == '0')) {
        if ((in_RDI[1] == 'x') || (in_RDI[1] == 'X')) {
          bVar1 = IntegerHexCastLoop<duckdb::IntegerDecimalCastData<signed_char>,false,false,duckdb::IntegerDecimalCastOperation>
                            ((char *)result,CONCAT17(strict,unaff_retaddr),
                             (IntegerDecimalCastData<signed_char> *)
                             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             SUB81((ulong)(in_RDI + 1) >> 0x38,0));
          return bVar1;
        }
        if ((in_RDI[1] == 'b') || (in_RDI[1] == 'B')) {
          bVar1 = IntegerBinaryCastLoop<duckdb::IntegerDecimalCastData<signed_char>,false,false,duckdb::IntegerDecimalCastOperation>
                            ((char *)result,CONCAT17(strict,unaff_retaddr),
                             (IntegerDecimalCastData<signed_char> *)
                             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             SUB81((ulong)(in_RDI + 1) >> 0x38,0));
          return bVar1;
        }
        if (((in_CL & 1) != 0) && (bVar1 = StringUtil::CharacterIsDigit(in_RDI[1]), bVar1)) {
          return false;
        }
      }
      bVar1 = IntegerCastLoop<duckdb::IntegerDecimalCastData<signed_char>,false,true,duckdb::IntegerDecimalCastOperation,(char)46>
                        (in_stack_00000028,in_stack_00000020,
                         (IntegerDecimalCastData<signed_char> *)buf,len._7_1_);
    }
  }
  return bVar1;
}

Assistant:

static bool TryIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (ZERO_INITIALIZE) {
		memset(&result, 0, sizeof(T));
	}
	// if the number is negative, we set the negative flag and skip the negative sign
	if (*buf == '-') {
		if (!IS_SIGNED) {
			// Need to check if its not -0
			idx_t pos = 1;
			while (pos < len) {
				if (buf[pos++] != '0') {
					return false;
				}
			}
		}
		return IntegerCastLoop<T, true, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
	}
	if (len > 1 && *buf == '0') {
		if (buf[1] == 'x' || buf[1] == 'X') {
			// If it starts with 0x or 0X, we parse it as a hex value
			buf++;
			len--;
			return IntegerHexCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (buf[1] == 'b' || buf[1] == 'B') {
			// If it starts with 0b or 0B, we parse it as a binary value
			buf++;
			len--;
			return IntegerBinaryCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (strict && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	return IntegerCastLoop<T, false, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
}